

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::Resource
          (Resource *this,DescriptorType _Type,bool _HasImmutableSampler)

{
  string msg;
  string local_20;
  
  this->Type = _Type;
  this->HasImmutableSampler = _HasImmutableSampler;
  *(undefined8 *)&this->BufferDynamicOffset = 0;
  *(undefined8 *)((long)&(this->pObject).m_pObject + 4) = 0;
  this->BufferBaseOffset = 0;
  this->BufferRangeSize = 0;
  if (CombinedImageSampler < _Type && _HasImmutableSampler) {
    FormatString<char[89]>
              (&local_20,
               (char (*) [89])
               "Immutable sampler can only be assigned to a combined image sampler or a separate sampler"
              );
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"Resource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0x68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_20._M_dataplus._M_p != &local_20.field_2) {
      operator_delete(local_20._M_dataplus._M_p,local_20.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit Resource(DescriptorType _Type, bool _HasImmutableSampler) noexcept :
            Type{_Type},
            HasImmutableSampler{_HasImmutableSampler}
        {
            VERIFY(Type == DescriptorType::CombinedImageSampler || Type == DescriptorType::Sampler || !HasImmutableSampler,
                   "Immutable sampler can only be assigned to a combined image sampler or a separate sampler");
        }